

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testInit
          (UniformBlockMemberOverlappingOffsetsTest *this)

{
  UniformBlockMemberOverlappingOffsetsTest *this_00;
  bool bVar1;
  bool bVar2;
  Type TVar3;
  char cVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  int iVar8;
  uint uVar9;
  GLuint stage;
  GLuint GVar10;
  long lVar11;
  GLuint stage_1;
  undefined4 uVar12;
  bool bVar13;
  testCase test_case;
  bool stage_support [6];
  Type local_a0;
  Type local_90;
  _Alloc_hider local_80;
  GLuint local_74;
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  GLuint local_58;
  uint local_54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char acStack_3e [6];
  pointer local_38;
  
  local_80._M_p = (pointer)this;
  for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
    this = (UniformBlockMemberOverlappingOffsetsTest *)local_80._M_p;
    cVar4 = (**(code **)(*(long *)local_80._M_p + 0x60))();
    acStack_3e[lVar11] = cVar4;
  }
  this_00 = (UniformBlockMemberOverlappingOffsetsTest *)(local_80._M_p + 0x78);
  for (local_38 = (pointer)0x0; (GLuint)local_38 != 0x22;
      local_38 = (pointer)(ulong)((int)local_38 + 1)) {
    local_90 = TestBase::getType((TestBase *)this,(GLuint)local_38);
    this = (UniformBlockMemberOverlappingOffsetsTest *)&local_90;
    local_74 = Utils::Type::GetBaseAlignment((Type *)this,false);
    local_74 = local_74 + (local_74 == 0);
    GVar10 = 0;
    while (GVar10 != 0x22) {
      local_70._0_4_ = GVar10;
      local_a0 = TestBase::getType((TestBase *)this,GVar10);
      GVar5 = Utils::Type::GetBaseAlignment(&local_a0,false);
      GVar6 = Utils::Type::GetBaseAlignment(&local_a0,false);
      GVar10 = local_74;
      GVar6 = GVar6 + (GVar6 == 0);
      GVar7 = lcm((UniformBlockMemberOverlappingOffsetsTest *)local_80._M_p,local_74,GVar6);
      uVar9 = (GVar7 + 1) % GVar6;
      iVar8 = GVar6 - uVar9;
      if (uVar9 == 0) {
        iVar8 = 0;
      }
      local_70._8_4_ = iVar8 + GVar7 + 1;
      uVar9 = (GVar7 - GVar5) % GVar6;
      iVar8 = GVar6 - uVar9;
      if (uVar9 == 0) {
        iVar8 = 0;
      }
      local_70._4_4_ = iVar8 + (GVar7 - GVar5);
      this = (UniformBlockMemberOverlappingOffsetsTest *)(ulong)(uint)local_70._4_4_;
      bVar1 = (uint)local_70._4_4_ < GVar7;
      uVar9 = GVar6 + local_70._4_4_;
      bVar13 = GVar7 < (uint)local_70._8_4_;
      bVar2 = (uint)local_70._8_4_ < GVar7 + GVar10;
      for (lVar11 = 0; TVar3 = local_a0, lVar11 != 6; lVar11 = lVar11 + 1) {
        if (acStack_3e[lVar11] != '\0') {
          uVar12 = (undefined4)lVar11;
          if (GVar7 < uVar9 && bVar1) {
            local_58 = local_90.m_n_rows;
            local_60._M_p = (pointer)local_90._0_8_;
            local_54 = local_70._4_4_;
            local_50._8_4_ = local_a0.m_n_rows;
            local_50._M_allocated_capacity._0_4_ = local_a0.m_basic_type;
            local_50._M_allocated_capacity._4_4_ = local_a0.m_n_columns;
            local_a0 = TVar3;
            local_70._12_4_ = GVar7;
            local_50._12_4_ = uVar12;
            std::
            vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
            ::push_back((vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                         *)this_00,(value_type *)(local_70 + 0xc));
          }
          TVar3 = local_a0;
          if (bVar2 && bVar13) {
            local_58 = local_90.m_n_rows;
            local_60._M_p = (pointer)local_90._0_8_;
            local_54 = local_70._8_4_;
            local_50._8_4_ = local_a0.m_n_rows;
            local_50._M_allocated_capacity._0_4_ = local_a0.m_basic_type;
            local_50._M_allocated_capacity._4_4_ = local_a0.m_n_columns;
            local_a0 = TVar3;
            local_70._12_4_ = GVar7;
            local_50._12_4_ = uVar12;
            std::
            vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
            ::push_back((vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                         *)this_00,(value_type *)(local_70 + 0xc));
          }
          TVar3 = local_a0;
          local_58 = local_90.m_n_rows;
          local_60._M_p = (pointer)local_90._0_8_;
          local_50._8_4_ = local_a0.m_n_rows;
          local_50._M_allocated_capacity._0_4_ = local_a0.m_basic_type;
          local_50._M_allocated_capacity._4_4_ = local_a0.m_n_columns;
          this = this_00;
          local_a0 = TVar3;
          local_70._12_4_ = GVar7;
          local_54 = GVar7;
          local_50._12_4_ = uVar12;
          std::
          vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
          ::push_back((vector<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::testCase>_>
                       *)this_00,(value_type *)(local_70 + 0xc));
        }
      }
      GVar10 = local_70._0_4_ + 1;
    }
  }
  return;
}

Assistant:

void UniformBlockMemberOverlappingOffsetsTest::testInit()
{
	const GLuint n_types = getTypesNumber();
	bool		 stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& boy_type = getType(i);
		const GLuint	   boy_size = boy_type.GetActualAlignment(1 /* align */, false /* is_array*/);

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& man_type  = getType(j);
			const GLuint	   man_align = man_type.GetBaseAlignment(false);
			const GLuint	   man_size  = man_type.GetActualAlignment(1 /* align */, false /* is_array*/);

			const GLuint boy_offset		  = lcm(boy_size, man_size);
			const GLuint man_after_start  = boy_offset + 1;
			const GLuint man_after_off	= man_type.GetActualOffset(man_after_start, man_size);
			const GLuint man_before_start = boy_offset - man_align;
			const GLuint man_before_off   = man_type.GetActualOffset(man_before_start, man_size);

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if (false == stage_support[stage])
				{
					continue;
				}

				if ((boy_offset > man_before_off) && (boy_offset < man_before_off + man_size))
				{
					testCase test_case = { boy_offset, boy_type, man_before_off, man_type,
										   (Utils::Shader::STAGES)stage };

					m_test_cases.push_back(test_case);
				}

				if ((boy_offset < man_after_off) && (boy_offset + boy_size > man_after_off))
				{
					testCase test_case = { boy_offset, boy_type, man_after_off, man_type,
										   (Utils::Shader::STAGES)stage };

					m_test_cases.push_back(test_case);
				}

				/* Boy offset, should be fine for both types */
				testCase test_case = { boy_offset, boy_type, boy_offset, man_type, (Utils::Shader::STAGES)stage };

				m_test_cases.push_back(test_case);
			}
		}
	}
}